

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_copy.c
# Opt level: O3

void test_copy(void)

{
  byte *__s;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  wchar_t wVar4;
  int iVar5;
  size_t v1;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  ulong uVar12;
  char buff [260];
  char buff2 [260];
  byte abStack_24a [274];
  char local_138 [264];
  
  lVar8 = 0;
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                  ,L'ů',L'\0');
  filenames[0] = strdup("");
  filenames[1] = strdup("1");
  filenames[2] = strdup("a2");
  uVar12 = 3;
  do {
    cVar11 = 'a';
    uVar7 = 0;
    lVar10 = -4;
    do {
      lVar9 = lVar10;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      abStack_24a[lVar9 + 6] =
           cVar11 + (char)(SUB164(auVar1 * ZEXT816(0x4ec4ec4ec4ec4ec5),8) >> 3) * -0x1a;
      uVar7 = uVar7 + 1;
      lVar10 = lVar9 + 1;
      cVar11 = cVar11 + '\x01';
    } while (lVar8 + lVar9 != -2);
    abStack_24a[uVar12 + 2] = 0;
    cVar11 = (char)(uVar12 / 10);
    abStack_24a[lVar9 + 6] = (char)uVar12 + cVar11 * -10 | 0x30;
    if (uVar12 < 10) {
      lVar10 = lVar9 + 3;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar12 / 10;
      abStack_24a[lVar9 + 5] = cVar11 + SUB161(auVar2 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      if (uVar12 < 100) {
        lVar10 = lVar9 + 2;
      }
      else {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar12 >> 2;
        abStack_24a[lVar9 + 4] = (byte)(SUB164(auVar3 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) | 0x30;
      }
    }
    abStack_24a[lVar10 + 2] = 0x5f;
    v1 = strlen((char *)(abStack_24a + 2));
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                        ,L'\x81',v1,"strlen(buff)",uVar12,"i",(void *)0x0);
    pcVar6 = strdup((char *)(abStack_24a + 2));
    filenames[uVar12] = pcVar6;
    uVar12 = uVar12 + 1;
    lVar8 = lVar8 + -1;
  } while (uVar12 != 0xc9);
  wVar4 = canSymlink();
  if (wVar4 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                   ,L'\x92');
    test_skipping("Symlink checks");
  }
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x95',"original",L'ǽ');
  iVar5 = chdir("original");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'\x96',0,"0",(long)iVar5,"chdir(\"original\")",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x99',"f",L'ǽ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x9a',"l",L'ǽ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x9b',"m",L'ǽ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x9c',"s",L'ǽ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x9d',"d",L'ǽ');
  uVar12 = 1;
  __s = abStack_24a + 2;
  do {
    failure("Internal sanity check failed: i = %d",uVar12 & 0xffffffff);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'¡',(uint)(filenames[uVar12] != (char *)0x0),"filenames[i] != NULL",
                     (void *)0x0);
    sprintf((char *)__s,"f/%s",filenames[uVar12]);
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                        ,L'¤',(char *)__s,L'ǿ',L'\xffffffff',__s);
    sprintf(local_138,"l/%s",filenames[uVar12]);
    assertion_make_hardlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
               ,L'¨',local_138,(char *)__s);
    sprintf(local_138,"m/%s",filenames[uVar12]);
    assertion_make_hardlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
               ,L'¬',local_138,(char *)__s);
    wVar4 = canSymlink();
    if (wVar4 != L'\0') {
      sprintf((char *)__s,"s/%s",filenames[uVar12]);
      sprintf(local_138,"../f/%s",filenames[uVar12]);
      failure("buff=\"%s\" buff2=\"%s\"",__s,local_138);
      assertion_make_symlink
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                 ,L'³',(char *)__s,local_138);
    }
    abStack_24a[2] = 100;
    failure("buff=\"%s\"",__s);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                       ,L'¸',(char *)__s,L'ǽ');
    uVar12 = uVar12 + 1;
  } while (uVar12 != 200);
  iVar5 = chdir("..");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'»',0,"0",(long)iVar5,"chdir(\"..\")",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'Ĥ',"plain",L'ǽ');
  iVar5 = chdir("plain");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ĥ',0,"0",(long)iVar5,"chdir(\"plain\")",(void *)0x0);
  wVar4 = systemf("%s cf archive -C ../original f d l m s >pack.out 2>pack.err",testprog);
  failure("Error invoking \"%s cf\"",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ĭ',(long)wVar4,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'İ',"pack.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'ı',"pack.out");
  wVar4 = systemf("%s xf archive >unpack.out 2>unpack.err",testprog);
  failure("Error invoking %s xf archive",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ĸ',(long)wVar4,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'Ļ',"unpack.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'ļ',"unpack.out");
  verify_tree(200);
  iVar5 = chdir("..");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'Ŀ',0,"0",(long)iVar5,"chdir(\"..\")",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'Ŏ',"ustar",L'ǽ');
  iVar5 = chdir("ustar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ŏ',0,"0",(long)iVar5,"chdir(target)",(void *)0x0);
  wVar4 = systemf("%s cf archive --format=ustar -C ../original f d l m s >pack.out 2>pack.err",
                  testprog);
  failure("Error invoking \"%s cf archive --format=ustar\"",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ŗ',(long)wVar4,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'Ś',"pack.out");
  wVar4 = systemf("%s xf archive >unpack.out 2>unpack.err",testprog);
  failure("Error invoking %s xf archive",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ţ',(long)wVar4,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'Ŧ',"unpack.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'ŧ',"unpack.out");
  verify_tree(100);
  iVar5 = chdir("../..");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'Ū',0,"0",(long)iVar5,"chdir(\"../..\")",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_copy)
{
	assertUmask(0);
	create_tree(); /* Create sample files in "original" dir. */

	/* Test simple "tar -c | tar -x" pipeline copy. */
	copy_basic();

	/* Same, but constrain to ustar format. */
	copy_ustar();
}